

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern-computer.cpp
# Opt level: O3

void __thiscall mahjong::PatternComputer::special(PatternComputer *this,PlayerHand *hand)

{
  _Rb_tree_header *p_Var1;
  void *mem;
  PatternComputer *pPVar2;
  pointer pPVar3;
  bool bVar4;
  Tile TVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  pointer pPVar8;
  initializer_list<mahjong::Tile> __l;
  pair<const_mahjong::Tile,_int> it_1;
  WiningHand wining_hand;
  Tile it;
  map<mahjong::Tile,_int,_std::less<mahjong::Tile>,_std::allocator<std::pair<const_mahjong::Tile,_int>_>_>
  unique_tiles;
  allocator_type local_101;
  PatternComputer *local_100;
  undefined8 local_f8;
  Tile local_f0;
  Tile local_ec;
  vector<mahjong::Pair,_std::allocator<mahjong::Pair>_> local_e8;
  vector<mahjong::Meld,_std::allocator<mahjong::Meld>_> vStack_d0;
  vector<mahjong::Tile,_std::allocator<mahjong::Tile>_> local_b8;
  Tile local_a0;
  Pair local_98;
  PlayerHand *local_80;
  vector<mahjong::Tile,_std::allocator<mahjong::Tile>_> local_78;
  _Rb_tree<mahjong::Tile,_std::pair<const_mahjong::Tile,_int>,_std::_Select1st<std::pair<const_mahjong::Tile,_int>_>,_std::less<mahjong::Tile>,_std::allocator<std::pair<const_mahjong::Tile,_int>_>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  PlayerHand::makeFreeTiles((FreeTiles *)&local_e8,hand);
  pPVar3 = local_e8.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_100 = this;
  if (local_e8.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_e8.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pPVar8 = local_e8.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_80 = hand;
    do {
      local_98.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ =
           *(undefined4 *)
            &(pPVar8->tiles).super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
             _M_impl.super__Vector_impl_data._M_start;
      bVar4 = IsSimple::operator()((IsSimple *)&local_f8,(Tile *)&local_98);
      if (!bVar4) {
        pmVar6 = std::
                 map<mahjong::Tile,_int,_std::less<mahjong::Tile>,_std::allocator<std::pair<const_mahjong::Tile,_int>_>_>
                 ::operator[]((map<mahjong::Tile,_int,_std::less<mahjong::Tile>,_std::allocator<std::pair<const_mahjong::Tile,_int>_>_>
                               *)&local_60,(key_type *)&local_98);
        *pmVar6 = *pmVar6 + 1;
      }
      pPVar8 = (pointer)((long)&(pPVar8->tiles).
                                super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                                _M_impl.super__Vector_impl_data._M_start + 4);
      hand = local_80;
    } while (pPVar8 != pPVar3);
  }
  pPVar2 = local_100;
  if (local_e8.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60._M_impl.super__Rb_tree_header._M_node_count == 0xd) {
    local_e8.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_e8.
                           super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,0x28);
    std::
    _Rb_tree<mahjong::Pattern,mahjong::Pattern,std::_Identity<mahjong::Pattern>,std::less<mahjong::Pattern>,std::allocator<mahjong::Pattern>>
    ::_M_assign_unique<mahjong::Pattern_const*>
              ((_Rb_tree<mahjong::Pattern,mahjong::Pattern,std::_Identity<mahjong::Pattern>,std::less<mahjong::Pattern>,std::allocator<mahjong::Pattern>>
                *)&pPVar2->highest_patterns,(Pattern *)&local_e8,
               (Pattern *)
               ((long)&local_e8.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
                       _M_impl.super__Vector_impl_data._M_start + 4));
    local_b8.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
    super__Vector_impl_data._M_finish = (Tile *)0x0;
    vStack_d0.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_d0.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_d0.super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (Tile *)0x0;
    local_a0 = PlayerHand::lastTile(hand);
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
      p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_f8 = *(undefined8 *)(p_Var7 + 1);
        TVar5 = (Tile)local_f8;
        if ((int)((ulong)local_f8 >> 0x20) == 2) {
          __l._M_len = 2;
          __l._M_array = &local_f0;
          local_f0 = TVar5;
          local_ec = TVar5;
          std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::vector
                    (&local_78,__l,&local_101);
          Pair::Pair(&local_98,&local_78);
          if (local_78.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_78.
                            super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_78.
                                  super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_78.
                                  super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::push_back(&local_e8,&local_98)
          ;
          mem = (void *)CONCAT44(local_98.tiles.
                                 super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 local_98.tiles.
                                 super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_4_);
          if (mem != (void *)0x0) {
            operator_delete(mem,(long)local_98.tiles.
                                      super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)mem
                           );
          }
        }
        else if (local_b8.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                 super__Vector_impl_data._M_finish ==
                 local_b8.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage) {
          std::vector<mahjong::Tile,std::allocator<mahjong::Tile>>::
          _M_realloc_insert<mahjong::Tile_const&>
                    ((vector<mahjong::Tile,std::allocator<mahjong::Tile>> *)&local_b8,
                     (iterator)
                     local_b8.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(Tile *)&local_f8);
        }
        else {
          *local_b8.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
           super__Vector_impl_data._M_finish = TVar5;
          local_b8.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_b8.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      } while ((_Rb_tree_header *)p_Var7 != p_Var1);
    }
    pPVar2 = local_100;
    std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::operator=
              (&(local_100->highest_wining_hand).pairs,&local_e8);
    std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::operator=
              (&(pPVar2->highest_wining_hand).melds,&vStack_d0);
    std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::operator=
              (&(pPVar2->highest_wining_hand).tiles,&local_b8);
    (pPVar2->highest_wining_hand).last_tile = local_a0;
    if (local_b8.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.
                            super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.
                            super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::~vector(&vStack_d0);
    std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::~vector(&local_e8);
  }
  std::
  _Rb_tree<mahjong::Tile,_std::pair<const_mahjong::Tile,_int>,_std::_Select1st<std::pair<const_mahjong::Tile,_int>_>,_std::less<mahjong::Tile>,_std::allocator<std::pair<const_mahjong::Tile,_int>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void PatternComputer::special(const PlayerHand& hand)
{
	map<Tile, int> unique_tiles;
	for (auto it : hand.makeFreeTiles())
	{
		if (IsSimple()(it)) continue;
		unique_tiles[it]++;
	}

	if (13 == unique_tiles.size())
	{
		highest_patterns = { Pattern::ThirteenOrphans };

		WiningHand wining_hand;
		wining_hand.last_tile = hand.lastTile();
		for (auto it : unique_tiles)
		{
			if (2 == it.second)
			{
				auto p = Pair({ it.first, it.first });
				wining_hand.pairs.push_back(p);
			}
			else
			{
				wining_hand.tiles.push_back(it.first);
			}
		}
		highest_wining_hand = wining_hand;
	}
}